

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_rowcol_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m128i *palVar1;
  int *piVar2;
  uint *puVar3;
  undefined4 *puVar4;
  __m128i *palVar5;
  undefined1 (*pauVar6) [12];
  undefined4 *puVar7;
  void *pvVar8;
  parasail_matrix_t *ppVar9;
  void *pvVar10;
  void *pvVar11;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [16];
  bool bVar30;
  int32_t index;
  uint uVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  parasail_result_t *ppVar36;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  long lVar37;
  ulong uVar38;
  uint uVar39;
  size_t len;
  __m128i *palVar40;
  int iVar41;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  bool bVar46;
  undefined4 in_register_00000084;
  __m128i *palVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  undefined1 auVar53 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ulong uVar61;
  ulong uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  uint uVar72;
  ulong uVar73;
  uint uVar80;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  uint uVar79;
  uint uVar81;
  undefined1 auVar78 [16];
  uint uVar82;
  uint uVar85;
  uint uVar87;
  undefined1 auVar83 [16];
  uint uVar86;
  uint uVar88;
  uint uVar89;
  uint uVar90;
  undefined1 auVar84 [16];
  uint uVar92;
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  int iVar94;
  uint uVar95;
  int iVar96;
  uint uVar97;
  int iVar98;
  uint uVar99;
  int iVar100;
  uint uVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  int iVar117;
  undefined1 auVar118 [16];
  uint uVar119;
  int iVar120;
  uint uVar121;
  int iVar122;
  uint uVar123;
  int iVar124;
  uint uVar125;
  int iVar126;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  undefined1 local_248 [16];
  undefined1 local_228 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  
  local_228._8_8_ = local_228._0_8_;
  len = CONCAT44(in_register_00000084,gap);
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar8 = (profile->profile32).score;
    if (pvVar8 == (void *)0x0) {
      parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar9 = profile->matrix;
      if (ppVar9 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar39 = profile->s1Len;
        if ((int)uVar39 < 1) {
          parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_1();
        }
        else {
          local_1a8._8_8_ = local_1a8._0_8_;
          local_1a8._0_8_ = len;
          uVar42 = uVar39 - 1;
          uVar49 = (ulong)uVar39 + 3 >> 2;
          uVar52 = (ulong)uVar42 % uVar49;
          iVar35 = (int)(uVar42 / uVar49);
          local_228._0_4_ = -open;
          local_228._4_4_ = 0;
          uVar31 = ppVar9->min;
          uVar33 = 0x80000000 - uVar31;
          if (uVar31 != local_228._0_4_ &&
              SBORROW4(uVar31,local_228._0_4_) == (int)(uVar31 + open) < 0) {
            uVar33 = open | 0x80000000;
          }
          pvVar10 = (profile->profile32).matches;
          uVar31 = 0x7ffffffe - ppVar9->max;
          local_198._0_4_ = uVar31;
          pvVar11 = (profile->profile32).similar;
          ppVar36 = parasail_result_new_rowcol3((uint)((ulong)uVar39 + 3) & 0x7ffffffc,s2Len);
          if (ppVar36 != (parasail_result_t *)0x0) {
            ppVar36->flag = ppVar36->flag | 0x4450401;
            b = parasail_memalign___m128i(0x10,uVar49);
            b_00 = parasail_memalign___m128i(0x10,uVar49);
            b_01 = parasail_memalign___m128i(0x10,uVar49);
            b_02 = parasail_memalign___m128i(0x10,uVar49);
            ptr = parasail_memalign___m128i(0x10,uVar49);
            b_03 = parasail_memalign___m128i(0x10,uVar49);
            b_04 = parasail_memalign___m128i(0x10,uVar49);
            b_05 = parasail_memalign___m128i(0x10,uVar49);
            ptr_00 = parasail_memalign___m128i(0x10,uVar49);
            ptr_01 = parasail_memalign___m128i(0x10,uVar49);
            ptr_02 = parasail_memalign___m128i(0x10,uVar49);
            ptr_03 = parasail_memalign___m128i(0x10,uVar49);
            ptr_04 = parasail_memalign___m128i(0x10,uVar49);
            ptr_05 = parasail_memalign___m128i(0x10,uVar49);
            ptr_06 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            auVar53._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar53._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar75._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar75._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
            auVar53 = packssdw(auVar53,auVar75);
            auVar63._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
            auVar63._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
            auVar112._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
            auVar112._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
            auVar63 = packssdw(auVar63,auVar112);
            auVar53 = packssdw(auVar53,auVar63);
            if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                  ptr_05 != (__m128i *)0x0) &&
                 ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) && ptr_02 != (__m128i *)0x0
                 )) && ptr_06 != (int32_t *)0x0) &&
                ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                              (auVar53 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar53 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar53 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar53 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar53 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar53 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar53 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar53 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar53 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar53 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar53[0xf])) {
              iVar32 = s2Len + -1;
              uVar33 = uVar33 + 1;
              iVar41 = (int)uVar49;
              iVar34 = -(iVar41 * gap);
              c[1] = uVar49;
              c[0] = uVar49;
              parasail_memset___m128i(b_03,c,len);
              c_00[1] = extraout_RDX;
              c_00[0] = uVar49;
              parasail_memset___m128i(b_04,c_00,len);
              c_01[1] = extraout_RDX_00;
              c_01[0] = uVar49;
              parasail_memset___m128i(b_05,c_01,len);
              c_02[1] = extraout_RDX_01;
              c_02[0] = uVar49;
              parasail_memset___m128i(b,c_02,len);
              c_03[1] = extraout_RDX_02;
              c_03[0] = uVar49;
              parasail_memset___m128i(b_00,c_03,len);
              c_04[1] = extraout_RDX_03;
              c_04[0] = uVar49;
              parasail_memset___m128i(b_01,c_04,len);
              c_05[1] = extraout_RDX_04;
              c_05[0] = uVar49;
              parasail_memset___m128i(b_02,c_05,len);
              auVar118._4_4_ = gap;
              auVar118._0_4_ = gap;
              auVar118._8_4_ = gap;
              auVar118._12_4_ = gap;
              auVar69._4_4_ = -open;
              auVar69._0_4_ = -open;
              auVar69._8_4_ = -open;
              auVar69._12_4_ = -open;
              uVar67 = (ulong)(iVar41 - 1);
              lVar37 = uVar67 << 4;
              auVar53 = pmovsxbd(extraout_XMM0,0x1010101);
              uVar38 = uVar49;
              do {
                *(undefined1 (*) [16])((long)*ptr_04 + lVar37) = auVar69;
                *(undefined1 (*) [16])((long)*ptr_05 + lVar37) = auVar53;
                auVar93._0_4_ = auVar69._0_4_ - gap;
                auVar93._4_4_ = auVar69._4_4_ - gap;
                auVar93._8_4_ = auVar69._8_4_ - gap;
                auVar93._12_4_ = auVar69._12_4_ - gap;
                auVar54._0_4_ = auVar53._0_4_ + 1;
                auVar54._4_4_ = auVar53._4_4_ + 1;
                auVar54._8_4_ = auVar53._8_4_ + 1;
                auVar54._12_4_ = auVar53._12_4_ + 1;
                lVar37 = lVar37 + -0x10;
                iVar117 = (int)uVar38;
                uVar39 = iVar117 - 1;
                uVar38 = (ulong)uVar39;
                auVar53 = auVar54;
                auVar69 = auVar93;
              } while (uVar39 != 0 && 0 < iVar117);
              auVar106._8_4_ = iVar41;
              auVar106._0_8_ = uVar49;
              auVar106._12_4_ = 0;
              auVar53 = pmovsxbq(auVar93,0x302);
              auVar63 = pmuldq(auVar53,auVar106);
              auVar53 = pmuldq(auVar106,_DAT_00903a90);
              uVar38 = 0;
              palVar40 = ptr;
              do {
                auVar111._8_4_ = (int)uVar38;
                auVar111._0_8_ = uVar38;
                auVar111._12_4_ = (int)(uVar38 >> 0x20);
                auVar74._0_4_ = (undefined4)(uVar38 + auVar53._0_8_);
                auVar74._4_4_ = (int)(auVar111._8_8_ + auVar53._8_8_);
                auVar74._8_4_ = (int)(auVar63._0_8_ + uVar38);
                auVar74._12_4_ = (int)(auVar63._8_8_ + auVar111._8_8_);
                auVar75 = pmulld(auVar74,auVar118);
                *(int *)*palVar40 = local_228._0_4_ - auVar75._0_4_;
                *(int *)((long)*palVar40 + 4) = local_228._0_4_ - auVar75._4_4_;
                *(int *)(*palVar40 + 1) = local_228._0_4_ - auVar75._8_4_;
                *(int *)((long)*palVar40 + 0xc) = local_228._0_4_ - auVar75._12_4_;
                uVar38 = uVar38 + 1;
                palVar40 = palVar40 + 1;
              } while (uVar49 != uVar38);
              *ptr_06 = 0;
              uVar43 = 0;
              auVar53 = pmovsxbq(auVar53,0x302);
              auVar63 = pmovsxbq(auVar63,0x100);
              uVar38 = (ulong)DAT_00906ca0;
              uVar50 = (ulong)(uint)s2Len - 1 ^ uVar38;
              do {
                auVar75 = local_228;
                iVar117 = local_228._0_4_;
                if ((bool)(~((long)uVar50 < (long)(uVar43 ^ uVar38)) & 1)) {
                  ptr_06[uVar43 + 1] = iVar117;
                }
                if ((long)((uVar43 | auVar63._0_8_) ^ uVar38) <= (long)uVar50) {
                  ptr_06[uVar43 + 2] = iVar117 - gap;
                }
                if ((long)((uVar43 | auVar53._0_8_) ^ uVar38) <= (long)uVar50) {
                  ptr_06[uVar43 + 3] = iVar117 + gap * -2;
                  ptr_06[uVar43 + 4] = iVar117 + gap * -3;
                }
                uVar43 = uVar43 + 4;
                local_228._4_4_ = 0;
                local_228._0_4_ = iVar117 + gap * -4;
                local_228._8_8_ = auVar75._8_8_;
              } while ((s2Len + 3U & 0xfffffffc) != uVar43);
              palVar5 = ptr + uVar67;
              palVar40 = b_03 + uVar67;
              palVar1 = b_04 + uVar67;
              palVar47 = b_05 + uVar67;
              uVar38 = 0;
              uVar39 = uVar33;
              uVar85 = uVar33;
              uVar87 = uVar33;
              uVar89 = uVar33;
              uVar95 = uVar31;
              uVar97 = uVar31;
              uVar99 = uVar31;
              uVar101 = uVar31;
              do {
                iStack_124 = (int)(*palVar1)[0];
                iStack_120 = *(int *)((long)*palVar1 + 4);
                iStack_11c = (int)(*palVar1)[1];
                iStack_134 = (int)(*palVar47)[0];
                iStack_130 = *(int *)((long)*palVar47 + 4);
                iStack_12c = (int)(*palVar47)[1];
                local_128 = 0;
                local_138 = 0;
                lVar37 = uVar49 * (long)ppVar9->mapper[(byte)s2[uVar38]] * 0x10;
                uVar119 = uVar33 - (int)(*ptr_04)[0];
                uVar121 = uVar33 - *(int *)((long)*ptr_04 + 4);
                uVar123 = uVar33 - (int)(*ptr_04)[1];
                uVar125 = uVar33 - *(int *)((long)*ptr_04 + 0xc);
                auVar75 = (undefined1  [16])0x0;
                lVar48 = 0;
                local_228 = ZEXT816(0);
                local_248 = ZEXT816(0);
                auVar53 = local_198;
                auVar63 = local_1a8;
                auVar77._0_4_ = uVar33;
                auVar77._4_4_ = uVar33;
                auVar77._8_4_ = uVar33;
                uVar92 = uVar33;
                local_198._0_4_ = 0;
                local_198._4_4_ = (int)(*palVar40)[0];
                local_198._8_4_ = *(int *)((long)*palVar40 + 4);
                local_198._12_4_ = (int)(*palVar40)[1];
                local_1a8._0_4_ = ptr_06[uVar38];
                local_1a8._4_4_ = (int)(*palVar5)[0];
                local_1a8._8_4_ = *(int *)((long)*palVar5 + 4);
                iVar117 = (int)(*palVar5)[1];
                do {
                  pauVar6 = (undefined1 (*) [12])((long)*ptr + lVar48);
                  auVar28 = *pauVar6;
                  iVar71 = *(int *)pauVar6[1];
                  auVar112 = *(undefined1 (*) [16])((long)*b_03 + lVar48);
                  piVar2 = (int *)((long)*b + lVar48);
                  iVar94 = *(int *)*pauVar6 - open;
                  iVar96 = *(int *)(*pauVar6 + 4) - open;
                  iVar98 = *(int *)(*pauVar6 + 8) - open;
                  iVar100 = iVar71 - open;
                  iVar102 = *piVar2 - auVar118._0_4_;
                  iVar103 = piVar2[1] - auVar118._4_4_;
                  iVar104 = piVar2[2] - auVar118._8_4_;
                  iVar105 = piVar2[3] - auVar118._12_4_;
                  auVar55._0_4_ = -(uint)(iVar102 < iVar94);
                  auVar55._4_4_ = -(uint)(iVar103 < iVar96);
                  auVar55._8_4_ = -(uint)(iVar104 < iVar98);
                  auVar55._12_4_ = -(uint)(iVar105 < iVar100);
                  auVar111 = blendvps(*(undefined1 (*) [16])((long)*b_00 + lVar48),auVar112,auVar55)
                  ;
                  auVar69 = *(undefined1 (*) [16])((long)*b_04 + lVar48);
                  auVar93 = blendvps(*(undefined1 (*) [16])((long)*b_01 + lVar48),auVar69,auVar55);
                  auVar54 = *(undefined1 (*) [16])((long)*b_05 + lVar48);
                  auVar106 = blendvps(*(undefined1 (*) [16])((long)*b_02 + lVar48),auVar54,auVar55);
                  piVar2 = (int *)((long)*ptr_04 + lVar48);
                  iVar120 = uVar119 + *piVar2;
                  iVar122 = uVar121 + piVar2[1];
                  iVar124 = uVar123 + piVar2[2];
                  iVar126 = uVar125 + piVar2[3];
                  auVar56._0_4_ = -(uint)((int)auVar77._0_4_ < iVar120);
                  auVar56._4_4_ = -(uint)((int)auVar77._4_4_ < iVar122);
                  auVar56._8_4_ = -(uint)((int)auVar77._8_4_ < iVar124);
                  auVar56._12_4_ = -(uint)((int)uVar92 < iVar126);
                  local_248 = blendvps(local_248,in_XMM12,auVar56);
                  local_228 = blendvps(local_228,auVar53,auVar56);
                  uVar119 = (uint)(iVar102 < iVar94) * iVar94 | (uint)(iVar102 >= iVar94) * iVar102;
                  uVar121 = (uint)(iVar103 < iVar96) * iVar96 | (uint)(iVar103 >= iVar96) * iVar103;
                  uVar123 = (uint)(iVar104 < iVar98) * iVar98 | (uint)(iVar104 >= iVar98) * iVar104;
                  uVar125 = (uint)(iVar105 < iVar100) * iVar100 |
                            (uint)(iVar105 >= iVar100) * iVar105;
                  auVar77._0_4_ =
                       (iVar120 < (int)auVar77._0_4_) * auVar77._0_4_ |
                       (uint)(iVar120 >= (int)auVar77._0_4_) * iVar120;
                  auVar77._4_4_ =
                       (iVar122 < (int)auVar77._4_4_) * auVar77._4_4_ |
                       (uint)(iVar122 >= (int)auVar77._4_4_) * iVar122;
                  auVar77._8_4_ =
                       (iVar124 < (int)auVar77._8_4_) * auVar77._8_4_ |
                       (uint)(iVar124 >= (int)auVar77._8_4_) * iVar124;
                  uVar92 = (iVar126 < (int)uVar92) * uVar92 |
                           (uint)(iVar126 >= (int)uVar92) * iVar126;
                  piVar2 = (int *)((long)*ptr_05 + lVar48);
                  auVar83._0_4_ = auVar63._0_4_ + *piVar2;
                  auVar83._4_4_ = auVar63._4_4_ + piVar2[1];
                  auVar83._8_4_ = auVar63._8_4_ + piVar2[2];
                  auVar83._12_4_ = auVar63._12_4_ + piVar2[3];
                  auVar75 = blendvps(auVar75,auVar83,auVar56);
                  piVar2 = (int *)((long)pvVar8 + lVar48 + lVar37);
                  iVar94 = local_1a8._0_4_ + *piVar2;
                  local_1a8._4_4_ = local_1a8._4_4_ + piVar2[1];
                  local_1a8._8_4_ = local_1a8._8_4_ + piVar2[2];
                  iVar117 = iVar117 + piVar2[3];
                  piVar2 = (int *)((long)pvVar10 + lVar48 + lVar37);
                  auVar108._0_4_ = local_198._0_4_ + *piVar2;
                  auVar108._4_4_ = local_198._4_4_ + piVar2[1];
                  auVar108._8_4_ = local_198._8_4_ + piVar2[2];
                  auVar108._12_4_ = local_198._12_4_ + piVar2[3];
                  piVar2 = (int *)((long)pvVar11 + lVar48 + lVar37);
                  auVar76._0_4_ = local_128 + *piVar2;
                  auVar76._4_4_ = iStack_124 + piVar2[1];
                  auVar76._8_4_ = iStack_120 + piVar2[2];
                  auVar76._12_4_ = iStack_11c + piVar2[3];
                  auVar57._0_4_ = -(uint)(iVar94 < (int)uVar119);
                  auVar57._4_4_ = -(uint)((int)local_1a8._4_4_ < (int)uVar121);
                  auVar57._8_4_ = -(uint)((int)local_1a8._8_4_ < (int)uVar123);
                  auVar57._12_4_ = -(uint)(iVar117 < (int)uVar125);
                  in_XMM12 = blendvps(auVar108,auVar111,auVar57);
                  auVar53 = blendvps(auVar76,auVar93,auVar57);
                  auVar107._0_4_ = auVar106._0_4_ + 1;
                  auVar107._4_4_ = auVar106._4_4_ + 1;
                  auVar107._8_4_ = auVar106._8_4_ + 1;
                  auVar107._12_4_ = auVar106._12_4_ + 1;
                  auVar64._0_4_ = local_138 + 1;
                  auVar64._4_4_ = iStack_134 + 1;
                  auVar64._8_4_ = iStack_130 + 1;
                  auVar64._12_4_ = iStack_12c + 1;
                  auVar63 = blendvps(auVar64,auVar107,auVar57);
                  puVar3 = (uint *)((long)*b + lVar48);
                  *puVar3 = uVar119;
                  puVar3[1] = uVar121;
                  puVar3[2] = uVar123;
                  puVar3[3] = uVar125;
                  *(undefined1 (*) [16])((long)*b_00 + lVar48) = auVar111;
                  *(undefined1 (*) [16])((long)*b_01 + lVar48) = auVar93;
                  *(undefined1 (*) [16])((long)*b_02 + lVar48) = auVar107;
                  uVar119 = (uint)((int)uVar119 < iVar94) * iVar94 |
                            ((int)uVar119 >= iVar94) * uVar119;
                  uVar121 = (uint)((int)uVar121 < (int)local_1a8._4_4_) * local_1a8._4_4_ |
                            ((int)uVar121 >= (int)local_1a8._4_4_) * uVar121;
                  uVar123 = (uint)((int)uVar123 < (int)local_1a8._8_4_) * local_1a8._8_4_ |
                            ((int)uVar123 >= (int)local_1a8._8_4_) * uVar123;
                  uVar125 = (uint)((int)uVar125 < iVar117) * iVar117 |
                            ((int)uVar125 >= iVar117) * uVar125;
                  piVar2 = (int *)((long)*ptr + lVar48);
                  *piVar2 = iVar94;
                  piVar2[1] = local_1a8._4_4_;
                  piVar2[2] = local_1a8._8_4_;
                  piVar2[3] = iVar117;
                  *(undefined1 (*) [16])((long)*b_03 + lVar48) = auVar108;
                  *(undefined1 (*) [16])((long)*b_04 + lVar48) = auVar76;
                  *(undefined1 (*) [16])((long)*b_05 + lVar48) = auVar64;
                  lVar48 = lVar48 + 0x10;
                  local_138 = auVar54._0_4_;
                  iStack_134 = auVar54._4_4_;
                  iStack_130 = auVar54._8_4_;
                  iStack_12c = auVar54._12_4_;
                  local_128 = auVar69._0_4_;
                  iStack_124 = auVar69._4_4_;
                  iStack_120 = auVar69._8_4_;
                  iStack_11c = auVar69._12_4_;
                  local_198._0_4_ = auVar112._0_4_;
                  local_198._4_4_ = auVar112._4_4_;
                  local_198._8_4_ = auVar112._8_4_;
                  local_198._12_4_ = auVar112._12_4_;
                  local_1a8._0_4_ = auVar28._0_4_;
                  local_1a8._4_4_ = auVar28._4_4_;
                  local_1a8._8_4_ = auVar28._8_4_;
                  iVar117 = iVar71;
                } while (uVar49 << 4 != lVar48);
                lVar37 = in_XMM12._8_8_;
                uVar67 = in_XMM12._0_8_;
                in_XMM12._0_8_ = uVar67 << 0x20;
                in_XMM12._8_8_ = lVar37 << 0x20 | uVar67 >> 0x20;
                local_198._0_8_ = auVar53._0_8_ << 0x20;
                local_198._8_8_ = auVar53._8_8_ << 0x20 | auVar53._0_8_ >> 0x20;
                local_1a8._0_8_ = auVar63._0_8_ << 0x20;
                local_1a8._8_8_ = auVar63._8_8_ << 0x20 | auVar63._0_8_ >> 0x20;
                iVar117 = ptr_06[uVar38 + 1];
                uVar67 = uVar38 + 1;
                iVar71 = (int)(*ptr_04)[0] + iVar117;
                iVar94 = *(int *)((long)*ptr_04 + 4) + uVar119;
                iVar96 = (int)(*ptr_04)[1] + uVar121;
                iVar98 = *(int *)((long)*ptr_04 + 0xc) + uVar123;
                auVar58._0_4_ = -(uint)(iVar71 < (int)auVar77._0_4_);
                auVar58._4_4_ = -(uint)(iVar94 < (int)auVar77._4_4_);
                auVar58._8_4_ = -(uint)(iVar96 < (int)auVar77._8_4_);
                auVar58._12_4_ = -(uint)(iVar98 < (int)uVar92);
                auVar77._0_4_ =
                     (iVar71 < (int)auVar77._0_4_) * auVar77._0_4_ |
                     (uint)(iVar71 >= (int)auVar77._0_4_) * iVar71;
                auVar77._4_4_ =
                     (iVar94 < (int)auVar77._4_4_) * auVar77._4_4_ |
                     (uint)(iVar94 >= (int)auVar77._4_4_) * iVar94;
                auVar77._8_4_ =
                     (iVar96 < (int)auVar77._8_4_) * auVar77._8_4_ |
                     (uint)(iVar96 >= (int)auVar77._8_4_) * iVar96;
                auVar77._12_4_ =
                     (iVar98 < (int)uVar92) * uVar92 | (uint)(iVar98 >= (int)uVar92) * iVar98;
                auVar53 = blendvps(in_XMM12,local_248,auVar58);
                auVar112 = blendvps(local_198,local_228,auVar58);
                auVar115._4_4_ = *(int *)((long)*ptr_05 + 4) + auVar63._0_4_;
                auVar115._0_4_ = (int)(*ptr_05)[0];
                auVar115._8_4_ = (int)(*ptr_05)[1] + auVar63._4_4_;
                auVar115._12_4_ = *(int *)((long)*ptr_05 + 0xc) + auVar63._8_4_;
                auVar63 = blendvps(auVar115,auVar75,auVar58);
                bVar30 = true;
                do {
                  bVar46 = bVar30;
                  auVar109._0_8_ = auVar53._0_8_ << 0x20;
                  auVar109._8_8_ = auVar53._8_8_ << 0x20 | auVar53._0_8_ >> 0x20;
                  auVar113._0_8_ = auVar112._0_8_ << 0x20;
                  auVar113._8_8_ = auVar112._8_8_ << 0x20 | auVar112._0_8_ >> 0x20;
                  auVar29._4_4_ = auVar63._4_4_ + iVar41;
                  auVar29._0_4_ = auVar63._0_4_ + iVar41;
                  auVar29._8_4_ = auVar63._8_4_ + iVar41;
                  auVar29._12_4_ = 0;
                  iVar96 = auVar77._0_4_;
                  iVar94 = iVar96 + iVar34;
                  iVar98 = auVar77._4_4_;
                  iVar102 = auVar77._8_4_;
                  iVar100 = iVar98 + iVar34;
                  iVar103 = iVar102 + iVar34;
                  auVar59._0_4_ = -(uint)((int)uVar33 < iVar96);
                  auVar59._4_4_ = -(uint)(iVar94 < iVar98);
                  iVar71 = auVar77._12_4_;
                  auVar59._8_4_ = -(uint)(iVar100 < iVar102);
                  auVar59._12_4_ = -(uint)(iVar103 < iVar71);
                  auVar77._0_4_ =
                       (uint)((int)uVar33 < iVar96) * iVar96 | ((int)uVar33 >= iVar96) * uVar33;
                  auVar77._4_4_ =
                       (uint)(iVar94 < iVar98) * iVar98 | (uint)(iVar94 >= iVar98) * iVar94;
                  auVar77._8_4_ =
                       (uint)(iVar100 < iVar102) * iVar102 | (uint)(iVar100 >= iVar102) * iVar100;
                  auVar77._12_4_ =
                       (uint)(iVar103 < iVar71) * iVar71 | (uint)(iVar103 >= iVar71) * iVar103;
                  auVar53 = blendvps(auVar109,auVar53,auVar59);
                  auVar112 = blendvps(auVar113,auVar112,auVar59);
                  auVar63 = blendvps(auVar29 << 0x20,auVar63,auVar59);
                  bVar30 = false;
                } while (bVar46);
                auVar60._0_4_ = -(uint)(iVar117 < (int)uVar33);
                auVar60._4_4_ = -(uint)((int)uVar119 < (int)auVar77._0_4_);
                auVar60._8_4_ = -(uint)((int)uVar121 < (int)auVar77._4_4_);
                auVar60._12_4_ = -(uint)((int)uVar123 < (int)auVar77._8_4_);
                auVar110._0_8_ = auVar53._0_8_ << 0x20;
                auVar110._8_8_ = auVar53._8_8_ << 0x20 | auVar53._0_8_ >> 0x20;
                auVar75 = blendvps(in_XMM12,auVar110,auVar60);
                uVar125 = (iVar117 < (int)uVar33) * uVar33 |
                          (uint)(iVar117 >= (int)uVar33) * iVar117;
                uVar119 = ((int)uVar119 < (int)auVar77._0_4_) * auVar77._0_4_ |
                          ((int)uVar119 >= (int)auVar77._0_4_) * uVar119;
                uVar121 = ((int)uVar121 < (int)auVar77._4_4_) * auVar77._4_4_ |
                          ((int)uVar121 >= (int)auVar77._4_4_) * uVar121;
                uVar123 = ((int)uVar123 < (int)auVar77._8_4_) * auVar77._8_4_ |
                          ((int)uVar123 >= (int)auVar77._8_4_) * uVar123;
                auVar114._0_8_ = auVar112._0_8_ << 0x20;
                auVar114._8_8_ = auVar112._8_8_ << 0x20 | auVar112._0_8_ >> 0x20;
                auVar53 = blendvps(local_198,auVar114,auVar60);
                auVar116._0_8_ = auVar63._0_8_ << 0x20;
                auVar116._8_8_ = auVar63._8_8_ << 0x20 | auVar63._0_8_ >> 0x20;
                auVar63 = blendvps(local_1a8,auVar116,auVar60);
                lVar37 = 0;
                uVar92 = uVar33;
                do {
                  iVar117 = uVar125 - open;
                  iVar71 = uVar119 - open;
                  iVar94 = uVar121 - open;
                  iVar96 = uVar123 - open;
                  iVar98 = uVar92 - gap;
                  iVar100 = auVar77._0_4_ - gap;
                  iVar102 = auVar77._4_4_ - gap;
                  iVar103 = auVar77._8_4_ - gap;
                  auVar65._0_4_ = -(uint)(iVar98 < iVar117);
                  auVar65._4_4_ = -(uint)(iVar100 < iVar71);
                  auVar65._8_4_ = -(uint)(iVar102 < iVar94);
                  auVar65._12_4_ = -(uint)(iVar103 < iVar96);
                  auVar110 = blendvps(auVar110,auVar75,auVar65);
                  auVar114 = blendvps(auVar114,auVar53,auVar65);
                  puVar3 = (uint *)((long)*ptr + lVar37);
                  uVar82 = *puVar3;
                  uVar86 = puVar3[1];
                  uVar88 = puVar3[2];
                  uVar90 = puVar3[3];
                  auVar53 = blendvps(auVar116,auVar63,auVar65);
                  uVar92 = (uint)(iVar117 < iVar98) * iVar98 | (uint)(iVar117 >= iVar98) * iVar117;
                  auVar77._0_4_ =
                       (uint)(iVar71 < iVar100) * iVar100 | (uint)(iVar71 >= iVar100) * iVar71;
                  auVar77._4_4_ =
                       (uint)(iVar94 < iVar102) * iVar102 | (uint)(iVar94 >= iVar102) * iVar94;
                  auVar77._8_4_ =
                       (uint)(iVar96 < iVar103) * iVar103 | (uint)(iVar96 >= iVar103) * iVar96;
                  piVar2 = (int *)((long)*b + lVar37);
                  iVar117 = *piVar2;
                  iVar71 = piVar2[1];
                  iVar94 = piVar2[2];
                  iVar96 = piVar2[3];
                  uVar72 = (iVar117 < (int)uVar82) * uVar82 |
                           (uint)(iVar117 >= (int)uVar82) * iVar117;
                  uVar79 = (iVar71 < (int)uVar86) * uVar86 | (uint)(iVar71 >= (int)uVar86) * iVar71;
                  uVar80 = (iVar94 < (int)uVar88) * uVar88 | (uint)(iVar94 >= (int)uVar88) * iVar94;
                  uVar81 = (iVar96 < (int)uVar90) * uVar90 | (uint)(iVar96 >= (int)uVar90) * iVar96;
                  uVar125 = ((int)uVar72 < (int)uVar92) * uVar92 |
                            ((int)uVar72 >= (int)uVar92) * uVar72;
                  uVar119 = ((int)uVar79 < (int)auVar77._0_4_) * auVar77._0_4_ |
                            ((int)uVar79 >= (int)auVar77._0_4_) * uVar79;
                  uVar121 = ((int)uVar80 < (int)auVar77._4_4_) * auVar77._4_4_ |
                            ((int)uVar80 >= (int)auVar77._4_4_) * uVar80;
                  uVar123 = ((int)uVar81 < (int)auVar77._8_4_) * auVar77._8_4_ |
                            ((int)uVar81 >= (int)auVar77._8_4_) * uVar81;
                  auVar70._0_4_ = -(uint)(uVar82 == uVar125);
                  auVar70._4_4_ = -(uint)(uVar86 == uVar119);
                  auVar70._8_4_ = -(uint)(uVar88 == uVar121);
                  auVar70._12_4_ = -(uint)(uVar90 == uVar123);
                  auVar78._0_4_ = -(uint)((int)uVar92 < (int)uVar72);
                  auVar78._4_4_ = -(uint)((int)auVar77._0_4_ < (int)uVar79);
                  auVar78._8_4_ = -(uint)((int)auVar77._4_4_ < (int)uVar80);
                  auVar78._12_4_ = -(uint)((int)auVar77._8_4_ < (int)uVar81);
                  auVar63 = blendvps(auVar110,*(undefined1 (*) [16])((long)*b_00 + lVar37),auVar78);
                  auVar75 = blendvps(auVar63,*(undefined1 (*) [16])((long)*b_03 + lVar37),auVar70);
                  auVar116._0_4_ = auVar53._0_4_ + 1;
                  auVar116._4_4_ = auVar53._4_4_ + 1;
                  auVar116._8_4_ = auVar53._8_4_ + 1;
                  auVar116._12_4_ = auVar53._12_4_ + 1;
                  auVar53 = blendvps(auVar114,*(undefined1 (*) [16])((long)*b_01 + lVar37),auVar78);
                  auVar53 = blendvps(auVar53,*(undefined1 (*) [16])((long)*b_04 + lVar37),auVar70);
                  auVar63 = blendvps(auVar116,*(undefined1 (*) [16])((long)*b_02 + lVar37),auVar78);
                  auVar63 = blendvps(auVar63,*(undefined1 (*) [16])((long)*b_05 + lVar37),auVar70);
                  puVar3 = (uint *)((long)*ptr + lVar37);
                  *puVar3 = uVar125;
                  puVar3[1] = uVar119;
                  puVar3[2] = uVar121;
                  puVar3[3] = uVar123;
                  *(undefined1 (*) [16])((long)*b_03 + lVar37) = auVar75;
                  *(undefined1 (*) [16])((long)*b_04 + lVar37) = auVar53;
                  *(undefined1 (*) [16])((long)*b_05 + lVar37) = auVar63;
                  uVar95 = ((int)uVar125 < (int)uVar95) * uVar125 |
                           ((int)uVar125 >= (int)uVar95) * uVar95;
                  uVar97 = ((int)uVar119 < (int)uVar97) * uVar119 |
                           ((int)uVar119 >= (int)uVar97) * uVar97;
                  uVar99 = ((int)uVar121 < (int)uVar99) * uVar121 |
                           ((int)uVar121 >= (int)uVar99) * uVar99;
                  uVar101 = ((int)uVar123 < (int)uVar101) * uVar123 |
                            ((int)uVar123 >= (int)uVar101) * uVar101;
                  uVar39 = ((int)uVar39 < (int)uVar125) * uVar125 |
                           ((int)uVar39 >= (int)uVar125) * uVar39;
                  uVar85 = ((int)uVar85 < (int)uVar119) * uVar119 |
                           ((int)uVar85 >= (int)uVar119) * uVar85;
                  uVar87 = ((int)uVar87 < (int)uVar121) * uVar121 |
                           ((int)uVar87 >= (int)uVar121) * uVar87;
                  uVar89 = ((int)uVar89 < (int)uVar123) * uVar123 |
                           ((int)uVar89 >= (int)uVar123) * uVar89;
                  iVar117 = auVar75._0_4_;
                  uVar39 = (uint)((int)uVar39 < iVar117) * iVar117 |
                           ((int)uVar39 >= iVar117) * uVar39;
                  iVar117 = auVar75._4_4_;
                  uVar85 = (uint)((int)uVar85 < iVar117) * iVar117 |
                           ((int)uVar85 >= iVar117) * uVar85;
                  iVar117 = auVar75._8_4_;
                  uVar87 = (uint)((int)uVar87 < iVar117) * iVar117 |
                           ((int)uVar87 >= iVar117) * uVar87;
                  iVar117 = auVar75._12_4_;
                  uVar89 = (uint)((int)uVar89 < iVar117) * iVar117 |
                           ((int)uVar89 >= iVar117) * uVar89;
                  iVar117 = auVar63._0_4_;
                  iVar71 = auVar53._0_4_;
                  uVar82 = (uint)(iVar71 < iVar117) * iVar117 | (uint)(iVar71 >= iVar117) * iVar71;
                  iVar117 = auVar63._4_4_;
                  iVar71 = auVar53._4_4_;
                  uVar86 = (uint)(iVar71 < iVar117) * iVar117 | (uint)(iVar71 >= iVar117) * iVar71;
                  iVar117 = auVar63._8_4_;
                  iVar71 = auVar53._8_4_;
                  iVar94 = auVar53._12_4_;
                  uVar88 = (uint)(iVar71 < iVar117) * iVar117 | (uint)(iVar71 >= iVar117) * iVar71;
                  iVar117 = auVar63._12_4_;
                  uVar90 = (uint)(iVar94 < iVar117) * iVar117 | (uint)(iVar94 >= iVar117) * iVar94;
                  uVar39 = ((int)uVar82 < (int)uVar39) * uVar39 |
                           ((int)uVar82 >= (int)uVar39) * uVar82;
                  uVar85 = ((int)uVar86 < (int)uVar85) * uVar85 |
                           ((int)uVar86 >= (int)uVar85) * uVar86;
                  uVar87 = ((int)uVar88 < (int)uVar87) * uVar87 |
                           ((int)uVar88 >= (int)uVar87) * uVar88;
                  uVar89 = ((int)uVar90 < (int)uVar89) * uVar89 |
                           ((int)uVar90 >= (int)uVar89) * uVar90;
                  lVar37 = lVar37 + 0x10;
                } while (uVar49 << 4 != lVar37);
                uVar43 = ptr[uVar52][1];
                uVar50 = b_03[uVar52][1];
                uVar66 = b_04[uVar52][1];
                uVar61 = b_05[uVar52][1];
                if (iVar35 < 3) {
                  iVar117 = 0;
                  uVar73 = ptr[uVar52][0];
                  uVar68 = b_03[uVar52][0];
                  uVar62 = b_04[uVar52][0];
                  uVar51 = b_05[uVar52][0];
                  do {
                    uVar43 = uVar43 << 0x20 | uVar73 >> 0x20;
                    uVar50 = uVar50 << 0x20 | uVar68 >> 0x20;
                    uVar66 = uVar66 << 0x20 | uVar62 >> 0x20;
                    uVar61 = uVar61 << 0x20 | uVar51 >> 0x20;
                    iVar117 = iVar117 + 1;
                    uVar73 = uVar73 << 0x20;
                    uVar68 = uVar68 << 0x20;
                    uVar62 = uVar62 << 0x20;
                    uVar51 = uVar51 << 0x20;
                  } while (iVar117 < 3 - iVar35);
                }
                *(int *)(*((ppVar36->field_4).trace)->trace_del_table + uVar38 * 4) =
                     (int)(uVar43 >> 0x20);
                *(int *)(*(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 8) +
                        uVar38 * 4) = (int)(uVar50 >> 0x20);
                *(int *)(*(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 0x10) +
                        uVar38 * 4) = (int)(uVar66 >> 0x20);
                *(int *)(*(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 0x18) +
                        uVar38 * 4) = (int)(uVar61 >> 0x20);
                uVar38 = uVar67;
              } while (uVar67 != (uint)s2Len);
              lVar37 = uVar49 * 4;
              lVar48 = uVar49 * 8;
              lVar12 = uVar49 * 0xc;
              lVar44 = 0;
              do {
                puVar7 = (undefined4 *)((long)*ptr + lVar44 * 4);
                uVar13 = puVar7[1];
                uVar14 = puVar7[2];
                uVar15 = puVar7[3];
                puVar4 = (undefined4 *)((long)*b_03 + lVar44 * 4);
                uVar16 = *puVar4;
                uVar17 = puVar4[1];
                uVar18 = puVar4[2];
                uVar19 = puVar4[3];
                puVar4 = (undefined4 *)((long)*b_04 + lVar44 * 4);
                uVar20 = *puVar4;
                uVar21 = puVar4[1];
                uVar22 = puVar4[2];
                uVar23 = puVar4[3];
                puVar4 = (undefined4 *)((long)*b_05 + lVar44 * 4);
                uVar24 = *puVar4;
                uVar25 = puVar4[1];
                uVar26 = puVar4[2];
                uVar27 = puVar4[3];
                lVar45 = *(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 0x20);
                *(undefined4 *)(lVar45 + lVar44) = *puVar7;
                lVar45 = lVar45 + lVar44;
                *(undefined4 *)(lVar37 + lVar45) = uVar13;
                *(undefined4 *)(lVar48 + lVar45) = uVar14;
                *(undefined4 *)(lVar12 + lVar45) = uVar15;
                lVar45 = *(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 0x28);
                *(undefined4 *)(lVar45 + lVar44) = uVar16;
                lVar45 = lVar45 + lVar44;
                *(undefined4 *)(lVar37 + lVar45) = uVar17;
                *(undefined4 *)(lVar48 + lVar45) = uVar18;
                *(undefined4 *)(lVar12 + lVar45) = uVar19;
                lVar45 = *(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 0x30);
                *(undefined4 *)(lVar45 + lVar44) = uVar20;
                lVar45 = lVar45 + lVar44;
                *(undefined4 *)(lVar37 + lVar45) = uVar21;
                *(undefined4 *)(lVar48 + lVar45) = uVar22;
                *(undefined4 *)(lVar12 + lVar45) = uVar23;
                lVar45 = *(long *)((long)((ppVar36->field_4).trace)->trace_del_table + 0x38);
                *(undefined4 *)(lVar45 + lVar44) = uVar24;
                lVar45 = lVar45 + lVar44;
                *(undefined4 *)(lVar37 + lVar45) = uVar25;
                *(undefined4 *)(lVar48 + lVar45) = uVar26;
                *(undefined4 *)(lVar12 + lVar45) = uVar27;
                lVar44 = lVar44 + 4;
              } while (lVar37 - lVar44 != 0);
              iVar34 = (int)uVar52 * 0x10;
              uVar49 = ptr[uVar52][1];
              uVar38 = b_03[uVar52][1];
              uVar67 = b_04[uVar52][1];
              uVar43 = b_05[uVar52][1];
              if (iVar35 < 3) {
                iVar34 = 0;
                uVar50 = ptr[uVar52][0];
                uVar66 = b_03[uVar52][0];
                uVar61 = b_04[uVar52][0];
                uVar52 = b_05[uVar52][0];
                do {
                  uVar49 = uVar49 << 0x20 | uVar50 >> 0x20;
                  uVar38 = uVar38 << 0x20 | uVar66 >> 0x20;
                  uVar67 = uVar67 << 0x20 | uVar61 >> 0x20;
                  uVar43 = uVar43 << 0x20 | uVar52 >> 0x20;
                  iVar34 = iVar34 + 1;
                  uVar50 = uVar50 << 0x20;
                  uVar66 = uVar66 << 0x20;
                  uVar61 = uVar61 << 0x20;
                  uVar52 = uVar52 << 0x20;
                } while (iVar34 < 3 - iVar35);
              }
              auVar91._0_4_ = -(uint)((int)uVar95 < (int)uVar33);
              auVar91._4_4_ = -(uint)((int)uVar97 < (int)uVar33);
              auVar91._8_4_ = -(uint)((int)uVar99 < (int)uVar33);
              auVar91._12_4_ = -(uint)((int)uVar101 < (int)uVar33);
              auVar84._0_4_ = -(uint)((int)uVar31 < (int)uVar39);
              auVar84._4_4_ = -(uint)((int)uVar31 < (int)uVar85);
              auVar84._8_4_ = -(uint)((int)uVar31 < (int)uVar87);
              auVar84._12_4_ = -(uint)((int)uVar31 < (int)uVar89);
              iVar35 = movmskps(iVar34,auVar84 | auVar91);
              if (iVar35 == 0) {
                iVar35 = (int)(uVar49 >> 0x20);
                iVar34 = (int)(uVar38 >> 0x20);
                iVar41 = (int)(uVar67 >> 0x20);
                iVar117 = (int)(uVar43 >> 0x20);
              }
              else {
                *(byte *)&ppVar36->flag = (byte)ppVar36->flag | 0x40;
                iVar35 = 0;
                iVar34 = 0;
                iVar41 = 0;
                iVar117 = 0;
                iVar32 = 0;
                uVar42 = 0;
              }
              ppVar36->score = iVar35;
              ppVar36->end_query = uVar42;
              ppVar36->end_ref = iVar32;
              ((ppVar36->field_4).stats)->matches = iVar34;
              ((ppVar36->field_4).stats)->similar = iVar41;
              ((ppVar36->field_4).stats)->length = iVar117;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar36;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32(vHp, vE);
            vH = _mm_max_epi32(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}